

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char sqlite3ExprAffinity(Expr *pExpr)

{
  short sVar1;
  byte bVar2;
  char cVar3;
  Table *pTVar4;
  ExprList *pEVar5;
  ExprList_item *pEVar6;
  
  do {
    bVar2 = pExpr->op;
LAB_0017b53c:
    if (bVar2 < 0xaa) {
      if (bVar2 == 0x24) {
        cVar3 = sqlite3AffinityType((pExpr->u).zToken,(Column *)0x0);
        return cVar3;
      }
      if (bVar2 == 0x8b) {
        pEVar5 = ((pExpr->x).pSelect)->pEList;
LAB_0017b5a4:
        pEVar6 = pEVar5->a;
        goto LAB_0017b5e1;
      }
      if (bVar2 == 0xa8) {
        pTVar4 = (pExpr->y).pTab;
LAB_0017b5fc:
        sVar1 = pExpr->iColumn;
        if ((long)sVar1 < 0) {
          return 'D';
        }
        if (pTVar4->nCol <= sVar1) {
          return 'D';
        }
        return pTVar4->aCol[sVar1].affinity;
      }
LAB_0017b57d:
      if ((pExpr->flags & 0x42000) != 0) goto LAB_0017b5dd;
      if ((bVar2 != 0xb0) || (bVar2 = pExpr->op2, bVar2 == 0xb0)) {
LAB_0017b5e9:
        return pExpr->affExpr;
      }
      goto LAB_0017b53c;
    }
    if (bVar2 == 0xb2) {
      pEVar6 = ((pExpr->pLeft->x).pSelect)->pEList->a + pExpr->iColumn;
      goto LAB_0017b5e1;
    }
    if (bVar2 == 0xb1) {
      pEVar5 = (pExpr->x).pList;
      goto LAB_0017b5a4;
    }
    if (bVar2 != 0xaa) goto LAB_0017b57d;
    pTVar4 = (pExpr->y).pTab;
    if (pTVar4 != (Table *)0x0) goto LAB_0017b5fc;
    if ((pExpr->flags & 0x42000) == 0) goto LAB_0017b5e9;
LAB_0017b5dd:
    pEVar6 = (ExprList_item *)&pExpr->pLeft;
LAB_0017b5e1:
    pExpr = pEVar6->pExpr;
  } while( true );
}

Assistant:

SQLITE_PRIVATE char sqlite3ExprAffinity(const Expr *pExpr){
  int op;
  op = pExpr->op;
  while( 1 /* exit-by-break */ ){
    if( op==TK_COLUMN || (op==TK_AGG_COLUMN && pExpr->y.pTab!=0) ){
      assert( ExprUseYTab(pExpr) );
      assert( pExpr->y.pTab!=0 );
      return sqlite3TableColumnAffinity(pExpr->y.pTab, pExpr->iColumn);
    }
    if( op==TK_SELECT ){
      assert( ExprUseXSelect(pExpr) );
      assert( pExpr->x.pSelect!=0 );
      assert( pExpr->x.pSelect->pEList!=0 );
      assert( pExpr->x.pSelect->pEList->a[0].pExpr!=0 );
      return sqlite3ExprAffinity(pExpr->x.pSelect->pEList->a[0].pExpr);
    }
#ifndef SQLITE_OMIT_CAST
    if( op==TK_CAST ){
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      return sqlite3AffinityType(pExpr->u.zToken, 0);
    }
#endif
    if( op==TK_SELECT_COLUMN ){
      assert( pExpr->pLeft!=0 && ExprUseXSelect(pExpr->pLeft) );
      assert( pExpr->iColumn < pExpr->iTable );
      assert( pExpr->iColumn >= 0 );
      assert( pExpr->iTable==pExpr->pLeft->x.pSelect->pEList->nExpr );
      return sqlite3ExprAffinity(
          pExpr->pLeft->x.pSelect->pEList->a[pExpr->iColumn].pExpr
      );
    }
    if( op==TK_VECTOR ){
      assert( ExprUseXList(pExpr) );
      return sqlite3ExprAffinity(pExpr->x.pList->a[0].pExpr);
    }
    if( ExprHasProperty(pExpr, EP_Skip|EP_IfNullRow) ){
      assert( pExpr->op==TK_COLLATE
           || pExpr->op==TK_IF_NULL_ROW
           || (pExpr->op==TK_REGISTER && pExpr->op2==TK_IF_NULL_ROW) );
      pExpr = pExpr->pLeft;
      op = pExpr->op;
      continue;
    }
    if( op!=TK_REGISTER ) break;
    op = pExpr->op2;
    if( NEVER( op==TK_REGISTER ) ) break;
  }
  return pExpr->affExpr;
}